

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdnslookup_p.cpp
# Opt level: O0

int __thiscall QDnsLookupRunnable::qt_metacall(QDnsLookupRunnable *this,Call _c,int _id,void **_a)

{
  int _id_00;
  void **in_RCX;
  uint in_EDX;
  int in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _id_00 = QObject::qt_metacall((Call)in_RDI,in_ESI,(void **)(ulong)in_EDX);
  if (-1 < _id_00) {
    if (in_ESI == 0) {
      if (_id_00 < 1) {
        qt_static_metacall(in_RDI,InvokeMetaMethod,_id_00,in_RCX);
      }
      _id_00 = _id_00 + -1;
    }
    if (in_ESI == 7) {
      if (_id_00 < 1) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      _id_00 = _id_00 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return _id_00;
}

Assistant:

int QDnsLookupRunnable::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}